

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall c4::yml::anon_unknown_0::_is_scalar_next__rmap(anon_unknown_0 *this,csubstr s)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  
  pcVar4 = s.str;
  if (((char *)0x1 < pcVar4) && (*this == (anon_unknown_0)0x3a)) {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 == 1) break;
      lVar1 = lVar3 + 1;
    } while (this[lVar3 + 1] == *(anon_unknown_0 *)("\": " + lVar3 + 2));
    if (lVar3 != 0) {
      return false;
    }
  }
  if (pcVar4 == (char *)0x0) {
    return true;
  }
  if (*this == (anon_unknown_0)0x23) {
    return false;
  }
  uVar2 = 0;
  do {
    uVar5 = uVar2;
    if (uVar5 == 3) break;
    uVar2 = uVar5 + 1;
  } while (*this != *(anon_unknown_0 *)("#,!&" + uVar5 + 1));
  if (2 >= uVar5 || pcVar4 < (char *)0x2) {
    return 2 < uVar5;
  }
  if (*this != (anon_unknown_0)0x3f) {
    return true;
  }
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 == 1) break;
    lVar1 = lVar3 + 1;
  } while (this[lVar3 + 1] == *(anon_unknown_0 *)("? " + lVar3 + 1));
  return lVar3 == 0;
}

Assistant:

bool begins_with(ro_substr pattern) const
    {
        if(len < pattern.len)
        {
            return false;
        }
        for(size_t i = 0; i < pattern.len; ++i)
        {
            if(str[i] != pattern[i])
            {
                return false;
            }
        }
        return true;
    }